

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

bool __thiscall tf::Executor::_wait_for_task(Executor *this,Worker *worker,Node **t)

{
  atomic<unsigned_long> *paVar1;
  Notifier *this_00;
  Notifier *pNVar2;
  uint64_t uVar3;
  size_t sVar4;
  ulong uVar5;
  __pointer_type pAVar6;
  atomic<long> aVar7;
  Waiter *pWVar8;
  pointer pWVar9;
  pointer pWVar10;
  pointer pWVar11;
  pointer pWVar12;
  long lVar13;
  result_type rVar14;
  pointer pWVar15;
  __base_type _Var16;
  Node *pNVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uniform_int_distribution<unsigned_long> local_40;
  
  paVar1 = &this->_num_thieves;
  this_00 = &this->_notifier;
LAB_00129e97:
  LOCK();
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  do {
    lVar13 = (long)(this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 7;
    local_40._M_param._M_b = lVar13 * -0x5555555555555555 - 1;
    local_40._M_param._M_a = 0;
    uVar19 = 0;
    uVar18 = 0;
    do {
      sVar4 = worker->_vtm;
      if (worker->_id == sVar4) {
        uVar5 = (this->_wsq)._top.super___atomic_base<long>._M_i;
        if ((long)uVar5 < (this->_wsq)._bottom.super___atomic_base<long>._M_i) {
          pAVar6 = (this->_wsq)._array._M_b._M_p;
          _Var16._M_p = pAVar6->S[pAVar6->M & uVar5]._M_b._M_p;
          LOCK();
          bVar20 = uVar5 == (this->_wsq)._top.super___atomic_base<long>._M_i;
          if (bVar20) {
            (this->_wsq)._top.super___atomic_base<long>._M_i = uVar5 + 1;
          }
          UNLOCK();
          goto LAB_00129f7d;
        }
LAB_00129f88:
        _Var16._M_p = (Node *)0x0;
      }
      else {
        pWVar15 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        aVar7.super___atomic_base<long>._M_i = pWVar15[sVar4]._wsq._top.super___atomic_base<long>;
        if (pWVar15[sVar4]._wsq._bottom.super___atomic_base<long>._M_i <=
            (long)aVar7.super___atomic_base<long>._M_i) goto LAB_00129f88;
        pAVar6 = pWVar15[sVar4]._wsq._array._M_b._M_p;
        _Var16._M_p = pAVar6->S[pAVar6->M & (ulong)aVar7.super___atomic_base<long>._M_i]._M_b._M_p;
        LOCK();
        bVar20 = aVar7.super___atomic_base<long>._M_i ==
                 (__atomic_base<long>)pWVar15[sVar4]._wsq._top.super___atomic_base<long>._M_i;
        if (bVar20) {
          pWVar15[sVar4]._wsq._top.super___atomic_base<long>._M_i =
               (aVar7.super___atomic_base<long>._M_i + 1)._M_i;
        }
        UNLOCK();
LAB_00129f7d:
        if (!bVar20) {
          _Var16._M_p = (Node *)0x0;
        }
      }
      *t = _Var16._M_p;
      if (_Var16._M_p != (Node *)0x0) break;
      if (lVar13 * 0x5555555555555556 + 2U < uVar18) {
        sched_yield();
        if (100 < uVar19) break;
        uVar19 = uVar19 + 1;
      }
      rVar14 = std::uniform_int_distribution<unsigned_long>::operator()
                         (&local_40,&worker->_rdgen,&local_40._M_param);
      worker->_vtm = rVar14;
      uVar18 = uVar18 + 1;
    } while (((this->_done)._M_base._M_i & 1U) == 0);
    if (*t != (Node *)0x0) {
LAB_0012a13a:
      LOCK();
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar1->super___atomic_base<unsigned_long>)._M_i != 0) {
        return true;
      }
      Notifier::notify(this_00,false);
      return true;
    }
    pWVar8 = worker->_waiter;
    LOCK();
    pNVar2 = &this->_notifier;
    uVar3 = (pNVar2->_state).super___atomic_base<unsigned_long>._M_i;
    (pNVar2->_state).super___atomic_base<unsigned_long>._M_i =
         (pNVar2->_state).super___atomic_base<unsigned_long>._M_i + 0x10000;
    UNLOCK();
    pWVar8->epoch = uVar3;
    if ((this->_wsq)._bottom.super___atomic_base<long>._M_i <=
        (this->_wsq)._top.super___atomic_base<long>._M_i) break;
    Notifier::cancel_wait(this_00,worker->_waiter);
    uVar18 = (this->_wsq)._top.super___atomic_base<long>._M_i;
    if ((long)uVar18 < (this->_wsq)._bottom.super___atomic_base<long>._M_i) {
      pAVar6 = (this->_wsq)._array._M_b._M_p;
      pNVar17 = pAVar6->S[pAVar6->M & uVar18]._M_b._M_p;
      LOCK();
      bVar20 = uVar18 == (this->_wsq)._top.super___atomic_base<long>._M_i;
      if (bVar20) {
        (this->_wsq)._top.super___atomic_base<long>._M_i = uVar18 + 1;
      }
      UNLOCK();
      if (!bVar20) {
        pNVar17 = (Node *)0x0;
      }
    }
    else {
      pNVar17 = (Node *)0x0;
    }
    *t = pNVar17;
    if (pNVar17 != (Node *)0x0) goto LAB_0012a13a;
    worker->_vtm = worker->_id;
  } while( true );
  if (((this->_done)._M_base._M_i & 1U) != 0) {
    Notifier::cancel_wait(this_00,worker->_waiter);
    Notifier::notify(this_00,true);
    LOCK();
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    return false;
  }
  LOCK();
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_long>)._M_i != 0) {
LAB_0012a128:
    Notifier::commit_wait(this_00,worker->_waiter);
    return true;
  }
  if ((this->_num_actives).super___atomic_base<unsigned_long>._M_i == 0) {
    pWVar15 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
              super__Vector_impl_data._M_start;
    pWVar9 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar20 = pWVar15 == pWVar9;
    if (bVar20) goto LAB_0012a128;
    pWVar10 = pWVar15;
    if ((pWVar15->_wsq)._bottom.super___atomic_base<long>._M_i <=
        (pWVar15->_wsq)._top.super___atomic_base<long>._M_i) {
      do {
        pWVar15 = pWVar10 + 1;
        bVar20 = pWVar15 == pWVar9;
        if (bVar20) goto LAB_0012a128;
        pWVar11 = pWVar10 + 1;
        pWVar12 = pWVar10 + 1;
        pWVar10 = pWVar15;
      } while ((pWVar11->_wsq)._bottom.super___atomic_base<long>._M_i <=
               (pWVar12->_wsq)._top.super___atomic_base<long>._M_i);
    }
    worker->_vtm = pWVar15->_id;
    Notifier::cancel_wait(this_00,worker->_waiter);
    if (bVar20) goto LAB_0012a128;
  }
  else {
    Notifier::cancel_wait(this_00,worker->_waiter);
  }
  goto LAB_00129e97;
}

Assistant:

inline bool Executor::_wait_for_task(Worker& worker, Node*& t) {

  wait_for_task:

  //assert(!t);

  ++_num_thieves;

  explore_task:

  _explore_task(worker, t);

  if(t) {
    if(_num_thieves.fetch_sub(1) == 1) {
      _notifier.notify(false);
    }
    return true;
  }

  _notifier.prepare_wait(worker._waiter);

  //if(auto vtm = _find_vtm(me); vtm != _workers.size()) {
  if(!_wsq.empty()) {

    _notifier.cancel_wait(worker._waiter);
    //t = (vtm == me) ? _wsq.steal() : _workers[vtm].wsq.steal();

    t = _wsq.steal();  // must steal here
    if(t) {
      if(_num_thieves.fetch_sub(1) == 1) {
        _notifier.notify(false);
      }
      return true;
    }
    else {
      worker._vtm = worker._id;
      goto explore_task;
    }
  }

  if(_done) {
    _notifier.cancel_wait(worker._waiter);
    _notifier.notify(true);
    --_num_thieves;
    return false;
  }

  if(_num_thieves.fetch_sub(1) == 1) {
    if(_num_actives) {
      _notifier.cancel_wait(worker._waiter);
      goto wait_for_task;
    }
    // check all queues again
    for(auto& w : _workers) {
      if(!w._wsq.empty()) {
        worker._vtm = w._id;
        _notifier.cancel_wait(worker._waiter);
        goto wait_for_task;
      }
    }
  }

  // Now I really need to relinguish my self to others
  _notifier.commit_wait(worker._waiter);

  return true;
}